

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimRel(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wrd_t *vVals)

{
  Vec_Wrd_t *vSimsIn;
  int *piVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int nWordsIn;
  int iVar4;
  Vec_Wrd_t *vRel;
  word *__s;
  Vec_Wrd_t *vSims;
  word *__s_00;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  uint nWords;
  int iVar9;
  int iVar11;
  uint uVar12;
  word *pSims;
  int __c;
  long lVar13;
  word *pwVar14;
  ulong uVar15;
  ulong uVar16;
  long local_98;
  ulong uVar10;
  
  vSimsIn = p->vSimsPi;
  nWordsIn = vSimsIn->nSize / p->vCis->nSize;
  iVar4 = vObjs->nSize;
  bVar6 = (byte)iVar4;
  uVar8 = 1 << (bVar6 & 0x1f);
  uVar5 = (ulong)uVar8;
  nWords = nWordsIn << (bVar6 & 0x1f);
  uVar10 = (ulong)nWords;
  vRel = (Vec_Wrd_t *)malloc(0x10);
  uVar12 = nWords;
  if (nWords - 1 < 0xf) {
    uVar12 = 0x10;
  }
  vRel->nCap = uVar12;
  if (uVar12 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar12 << 3);
  }
  vRel->pArray = __s;
  vRel->nSize = nWords;
  memset(__s,0,(long)(int)nWords * 8);
  iVar9 = p->nObjs * nWordsIn << (bVar6 & 0x1f);
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar11 = iVar9;
  }
  vSims->nCap = iVar11;
  if (iVar11 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)iVar11 << 3);
  }
  vSims->pArray = __s_00;
  vSims->nSize = iVar9;
  memset(__s_00,0,(long)iVar9 << 3);
  Gia_ManSimRelAssignInputs(p,nWords,vSims,nWordsIn,vSimsIn);
  iVar11 = vObjs->nSize;
  if (0 < (long)iVar11) {
    piVar1 = vObjs->pArray;
    if ((int)uVar8 < 2) {
      uVar5 = 1;
    }
    local_98 = 0;
    do {
      if (iVar4 != 0x1f) {
        uVar12 = (piVar1[local_98] << (bVar6 & 0x1f)) * nWordsIn;
        uVar15 = 0;
        do {
          if ((1 << ((byte)local_98 & 0x1f) & (uint)uVar15) == 0) {
            if (iVar9 <= (int)uVar12 || (int)uVar12 < 0) goto LAB_007d54e5;
            __c = 0;
          }
          else {
            if (iVar9 <= (int)uVar12 || (int)uVar12 < 0) {
LAB_007d54e5:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            __c = 0xff;
          }
          memset(__s_00 + uVar12,__c,(long)nWordsIn << 3);
          uVar15 = uVar15 + 1;
          uVar12 = uVar12 + nWordsIn;
        } while (uVar5 != uVar15);
      }
      local_98 = local_98 + 1;
    } while (local_98 != iVar11);
  }
  Gia_ManCleanPhase(p);
  uVar5 = (ulong)(uint)vObjs->nSize;
  if (vObjs->nSize < 1) {
    bVar3 = false;
  }
  else {
    lVar7 = 0;
    do {
      iVar11 = (int)uVar5;
      iVar4 = vObjs->pArray[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007d5504;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      *(ulong *)pGVar2 = *(ulong *)pGVar2 | 0x8000000000000000;
      lVar7 = lVar7 + 1;
      iVar11 = vObjs->nSize;
      uVar5 = (ulong)iVar11;
    } while (lVar7 < (long)uVar5);
    bVar3 = 0 < iVar11;
  }
  iVar4 = p->nObjs;
  if ((0 < (long)iVar4) && (pGVar2 = p->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
    lVar7 = 0;
    pwVar14 = __s_00;
    do {
      uVar5 = *(ulong *)(pGVar2 + lVar7);
      if ((uVar5 & 0x8000000080000000) == 0 && (~(uint)uVar5 & 0x1fffffff) != 0) {
        uVar15 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar5 >> 0x1a) & 8));
        uVar12 = (uint)(uVar5 >> 0x20);
        uVar16 = Cnf_CutDeriveTruth::C[uVar12 >> 0x1d & 1];
        uVar8 = (uint)uVar5 & 0x1fffffff;
        uVar12 = uVar12 & 0x1fffffff;
        iVar11 = (int)lVar7;
        if (uVar8 < uVar12) {
          if (0 < (int)nWords) {
            uVar5 = 0;
            do {
              pwVar14[uVar5] =
                   __s_00[(long)(int)((iVar11 - uVar8) * nWords) + uVar5] ^
                   __s_00[(long)(int)((iVar11 - uVar12) * nWords) + uVar5] ^ uVar15 ^ uVar16;
              uVar5 = uVar5 + 1;
            } while (uVar10 != uVar5);
          }
        }
        else if (0 < (int)nWords) {
          uVar5 = 0;
          do {
            pwVar14[uVar5] =
                 (__s_00[(long)(int)((iVar11 - uVar12) * nWords) + uVar5] ^ uVar16) &
                 (__s_00[(long)(int)((iVar11 - uVar8) * nWords) + uVar5] ^ uVar15);
            uVar5 = uVar5 + 1;
          } while (uVar10 != uVar5);
        }
      }
      lVar7 = lVar7 + 1;
      pwVar14 = pwVar14 + (int)nWords;
    } while (lVar7 != iVar4);
  }
  lVar7 = (long)p->vCos->nSize;
  if (0 < lVar7) {
    piVar1 = p->vCos->pArray;
    lVar13 = 0;
    do {
      iVar11 = piVar1[lVar13];
      if (((long)iVar11 < 0) || (iVar4 <= iVar11)) goto LAB_007d5504;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)(p->pObjs + iVar11);
      if ((-1 < (long)uVar5) && (0 < (int)nWords)) {
        uVar15 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar5 >> 0x1a) & 8));
        uVar16 = 0;
        do {
          __s_00[(long)(int)(iVar11 * nWords) + uVar16] =
               __s_00[(long)(int)((iVar11 - ((uint)uVar5 & 0x1fffffff)) * nWords) + uVar16] ^ uVar15
          ;
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar7);
  }
  if (bVar3) {
    lVar7 = 0;
    do {
      iVar4 = vObjs->pArray[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_007d5504:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vObjs->nSize);
  }
  iVar4 = Gia_ManSimRelCollectOutputs(p,nWords,vSims,nWordsIn,vVals,vRel);
  if (iVar4 != 0) {
    if (__s != (word *)0x0) {
      free(__s);
    }
    free(vRel);
    vRel = (Vec_Wrd_t *)0x0;
  }
  if (__s_00 != (word *)0x0) {
    free(__s_00);
  }
  free(vSims);
  return vRel;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRel( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wrd_t * vVals )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = 1 << Vec_IntSize(vObjs), i, m, iObj;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vRel  = Vec_WrdStart( nWords * nMints );
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords * nMints );
    Gia_ManSimRelAssignInputs( p, nWords * nMints, vSims, nWords, p->vSimsPi );
    Vec_IntForEachEntry( vObjs, iObj, i )
        for ( m = 0; m < nMints; m++ )
            if ( (m >> i) & 1 )
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0xFF, sizeof(word)*nWords );    
            else
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0x00, sizeof(word)*nWords );    
    Gia_ManCleanPhase( p );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 1;
    Gia_ManForEachAnd( p, pObj, i ) 
        if ( !pObj->fPhase )
            Gia_ManSimPatSimAnd( p, i, pObj, nWords * nMints, vSims );
    Gia_ManForEachCo( p, pObj, i )
        if ( !pObj->fPhase )
            Gia_ManSimPatSimPo( p, Gia_ObjId(p, pObj), pObj, nWords * nMints, vSims );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 0;
    if ( Gia_ManSimRelCollectOutputs( p, nWords * nMints, vSims, nWords, vVals, vRel ) )
        Vec_WrdFreeP( &vRel );
    Vec_WrdFree( vSims );
    return vRel;
}